

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::Substitution::
~Substitution(Substitution *this)

{
  Applicator *pAVar1;
  void **head_1;
  void **head;
  
  (this->super_ResultSubstitution)._vptr_ResultSubstitution =
       (_func_int **)&PTR__Substitution_00b2c0e8;
  pAVar1 = this->_applicator;
  if (pAVar1 != (Applicator *)0x0) {
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&pAVar1->_cache);
    pAVar1->_parent = (GenMatcher *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAVar1;
  }
  (this->super_ResultSubstitution)._vptr_ResultSubstitution =
       (_func_int **)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = this;
  return;
}

Assistant:

~Substitution()
  {
    if(_applicator) {
      delete _applicator;
    }
  }